

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O2

Status __thiscall spvtools::opt::FixStorageClass::Process(FixStorageClass *this)

{
  bool modified;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &modified;
  modified = false;
  local_10 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fix_storage_class.cpp:28:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fix_storage_class.cpp:28:29)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  Module::ForEachInst((((this->super_Pass).context_)->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                      (function<void_(spvtools::opt::Instruction_*)> *)&local_28,false);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return modified ^ SuccessWithoutChange;
}

Assistant:

Pass::Status FixStorageClass::Process() {
  bool modified = false;

  get_module()->ForEachInst([this, &modified](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpVariable) {
      std::set<uint32_t> seen;
      std::vector<std::pair<Instruction*, uint32_t>> uses;
      get_def_use_mgr()->ForEachUse(inst,
                                    [&uses](Instruction* use, uint32_t op_idx) {
                                      uses.push_back({use, op_idx});
                                    });

      for (auto& use : uses) {
        modified |= PropagateStorageClass(
            use.first,
            static_cast<spv::StorageClass>(inst->GetSingleWordInOperand(0)),
            &seen);
        assert(seen.empty() && "Seen was not properly reset.");
        modified |=
            PropagateType(use.first, inst->type_id(), use.second, &seen);
        assert(seen.empty() && "Seen was not properly reset.");
      }
    }
  });
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}